

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyMultiDrawAttribs(MultiDrawAttribs *Attribs)

{
  char (*in_R8) [26];
  string msg;
  string local_30;
  
  if ((Attribs->DrawCount != 0) && (Attribs->pDrawItems == (MultiDrawItem *)0x0)) {
    FormatString<char[14],unsigned_int,char[26]>
              (&local_30,(Diligent *)"DrawCount is ",(char (*) [14])Attribs,
               (uint *)", but pDrawItems is null.",in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"VerifyMultiDrawAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xdc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->NumInstances == 0) {
    FormatString<char[110]>
              (&local_30,
               (char (*) [110])
               "MultiDrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_30._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool VerifyMultiDrawAttribs(const MultiDrawAttribs& Attribs)
{
    DEV_CHECK_ERR(Attribs.DrawCount == 0 || Attribs.pDrawItems != nullptr, "DrawCount is ", Attribs.DrawCount, ", but pDrawItems is null.");

    if (Attribs.NumInstances == 0)
        LOG_INFO_MESSAGE("MultiDrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional.");

    return true;
}